

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaComponentListFree(xmlSchemaItemListPtr list)

{
  xmlSchemaTypeType xVar1;
  void **ppvVar2;
  xmlSchemaTypePtr type;
  xmlSchemaTypePtr pxVar3;
  xmlSchemaTypePtr pxVar4;
  int iVar5;
  xmlChar *extra;
  xmlSchemaAnnotPtr pxVar6;
  xmlSchemaAttributePtr_conflict value;
  long lVar7;
  
  iVar5 = list->nbItems;
  if (iVar5 == 0) {
    return;
  }
  ppvVar2 = list->items;
  lVar7 = 0;
LAB_001afe0b:
  if (iVar5 <= lVar7) {
    list->nbItems = 0;
    return;
  }
  type = (xmlSchemaTypePtr)ppvVar2[lVar7];
  if (type == (xmlSchemaTypePtr)0x0) goto LAB_001aff94;
  xVar1 = type->type;
  switch(xVar1) {
  case XML_SCHEMA_TYPE_ANY:
  case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr)type);
    break;
  case XML_SCHEMA_TYPE_FACET:
  case XML_SCHEMA_TYPE_SIMPLE_CONTENT:
  case XML_SCHEMA_TYPE_COMPLEX_CONTENT:
  case XML_SCHEMA_TYPE_UR:
  case XML_SCHEMA_TYPE_RESTRICTION:
  case XML_SCHEMA_TYPE_EXTENSION:
  case XML_SCHEMA_TYPE_LIST:
  case XML_SCHEMA_TYPE_UNION:
    goto switchD_001afe3a_caseD_3;
  case XML_SCHEMA_TYPE_SIMPLE:
  case XML_SCHEMA_TYPE_COMPLEX:
    xmlSchemaFreeType(type);
    break;
  case XML_SCHEMA_TYPE_SEQUENCE:
  case XML_SCHEMA_TYPE_CHOICE:
  case XML_SCHEMA_TYPE_ALL:
  case XML_SCHEMA_TYPE_GROUP:
  case XML_SCHEMA_TYPE_PARTICLE:
    if (type->next != (_xmlSchemaType *)0x0) {
      xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)type->next);
    }
  case XML_SCHEMA_TYPE_NOTATION:
switchD_001afe3a_caseD_12:
    (*xmlFree)(type);
    break;
  case XML_SCHEMA_TYPE_ELEMENT:
    if (type->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(type->annot);
    }
    if (*(xmlRegexpPtr *)&type->builtInType != (xmlRegexpPtr)0x0) {
      xmlRegFreeRegexp(*(xmlRegexpPtr *)&type->builtInType);
    }
    value = (xmlSchemaAttributePtr_conflict)type->refPrefix;
    goto LAB_001aff66;
  case XML_SCHEMA_TYPE_ATTRIBUTE:
    if (type->attributes != (xmlSchemaAttributePtr_conflict)0x0) {
      xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)type->attributes);
    }
    value = *(xmlSchemaAttributePtr_conflict *)&type->recurse;
    goto LAB_001aff66;
  case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
    if (type->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(type->annot);
    }
    if (type->baseType != (xmlSchemaTypePtr)0x0) {
      xmlSchemaItemListFree((xmlSchemaItemListPtr)type->baseType);
    }
    goto switchD_001afe3a_caseD_12;
  case XML_SCHEMA_TYPE_IDC_UNIQUE:
  case XML_SCHEMA_TYPE_IDC_KEY:
  case XML_SCHEMA_TYPE_IDC_KEYREF:
    if (type->next != (_xmlSchemaType *)0x0) {
      xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)type->next);
    }
    pxVar6 = type->annot;
    if (pxVar6 != (xmlSchemaAnnotPtr)0x0) {
      if ((xmlPatternPtr)pxVar6[2].next != (xmlPatternPtr)0x0) {
        xmlFreePattern((xmlPatternPtr)pxVar6[2].next);
        pxVar6 = type->annot;
      }
      (*xmlFree)(pxVar6);
    }
    pxVar4 = type->subtypes;
    while (pxVar4 != (xmlSchemaTypePtr)0x0) {
      pxVar3 = *(xmlSchemaTypePtr *)pxVar4;
      if ((xmlPatternPtr)pxVar4->ref != (xmlPatternPtr)0x0) {
        xmlFreePattern((xmlPatternPtr)pxVar4->ref);
      }
      (*xmlFree)(pxVar4);
      pxVar4 = pxVar3;
    }
    (*xmlFree)(type);
    break;
  case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
    if (type->next != (_xmlSchemaType *)0x0) {
      xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)type->next);
    }
    value = type->attributes;
LAB_001aff66:
    if (value != (xmlSchemaAttributePtr_conflict)0x0) {
      xmlSchemaFreeValue((xmlSchemaValPtr)value);
    }
    goto switchD_001afe3a_caseD_12;
  default:
    if ((xVar1 == XML_SCHEMA_EXTRA_QNAMEREF) || (xVar1 == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB))
    goto switchD_001afe3a_caseD_12;
    goto switchD_001afe3a_caseD_3;
  }
LAB_001aff94:
  lVar7 = lVar7 + 1;
  iVar5 = list->nbItems;
  goto LAB_001afe0b;
switchD_001afe3a_caseD_3:
  extra = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)type);
  __xmlSimpleError(0x10,0xbfd,(xmlNodePtr)0x0,
                   "Internal error: xmlSchemaComponentListFree, unexpected component type \'%s\'\n",
                   (char *)extra);
  goto LAB_001aff94;
}

Assistant:

static void
xmlSchemaComponentListFree(xmlSchemaItemListPtr list)
{
    if ((list == NULL) || (list->nbItems == 0))
	return;
    {
	xmlSchemaTreeItemPtr item;
	xmlSchemaTreeItemPtr *items = (xmlSchemaTreeItemPtr *) list->items;
	int i;

	for (i = 0; i < list->nbItems; i++) {
	    item = items[i];
	    if (item == NULL)
		continue;
	    switch (item->type) {
		case XML_SCHEMA_TYPE_SIMPLE:
		case XML_SCHEMA_TYPE_COMPLEX:
		    xmlSchemaFreeType((xmlSchemaTypePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE:
		    xmlSchemaFreeAttribute((xmlSchemaAttributePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
		    xmlSchemaFreeAttributeUse((xmlSchemaAttributeUsePtr) item);
		    break;
		case XML_SCHEMA_EXTRA_ATTR_USE_PROHIB:
		    xmlSchemaFreeAttributeUseProhib(
			(xmlSchemaAttributeUseProhibPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ELEMENT:
		    xmlSchemaFreeElement((xmlSchemaElementPtr) item);
		    break;
		case XML_SCHEMA_TYPE_PARTICLE:
		    if (item->annot != NULL)
			xmlSchemaFreeAnnot(item->annot);
		    xmlFree(item);
		    break;
		case XML_SCHEMA_TYPE_SEQUENCE:
		case XML_SCHEMA_TYPE_CHOICE:
		case XML_SCHEMA_TYPE_ALL:
		    xmlSchemaFreeModelGroup((xmlSchemaModelGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    xmlSchemaFreeAttributeGroup(
			(xmlSchemaAttributeGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    xmlSchemaFreeModelGroupDef(
			(xmlSchemaModelGroupDefPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ANY:
		case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
		    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr) item);
		    break;
		case XML_SCHEMA_TYPE_IDC_KEY:
		case XML_SCHEMA_TYPE_IDC_UNIQUE:
		case XML_SCHEMA_TYPE_IDC_KEYREF:
		    xmlSchemaFreeIDC((xmlSchemaIDCPtr) item);
		    break;
		case XML_SCHEMA_TYPE_NOTATION:
		    xmlSchemaFreeNotation((xmlSchemaNotationPtr) item);
		    break;
		case XML_SCHEMA_EXTRA_QNAMEREF:
		    xmlSchemaFreeQNameRef((xmlSchemaQNameRefPtr) item);
		    break;
		default: {
		    /* TODO: This should never be hit. */
		    xmlSchemaPSimpleInternalErr(NULL,
			"Internal error: xmlSchemaComponentListFree, "
			"unexpected component type '%s'\n",
			(const xmlChar *) WXS_ITEM_TYPE_NAME(item));
			 }
		    break;
	    }
	}
	list->nbItems = 0;
    }
}